

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

void rw::uninstColor(int type,RGBA *dst,uint8 *src,uint32 numVertices,uint32 stride)

{
  uint8 *puVar1;
  long lVar2;
  
  puVar1 = src + 3;
  for (lVar2 = 0; numVertices != (uint32)lVar2; lVar2 = lVar2 + 1) {
    dst[lVar2].red = puVar1[-1];
    dst[lVar2].green = puVar1[-2];
    dst[lVar2].blue = puVar1[-3];
    dst[lVar2].alpha = *puVar1;
    puVar1 = puVar1 + stride;
  }
  return;
}

Assistant:

void
uninstColor(int type, RGBA *dst, uint8 *src, uint32 numVertices, uint32 stride)
{
	assert(type == VERT_ARGB);
	for(uint32 i = 0; i < numVertices; i++){
		dst->red = src[2];
		dst->green = src[1];
		dst->blue = src[0];
		dst->alpha = src[3];
		src += stride;
		dst++;
	}
}